

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

void IDLExport::checkType(Type *type)

{
  int iVar1;
  UnsupportedType *pUVar2;
  allocator local_39;
  string local_38;
  
  iVar1 = Typelib::Type::getCategory();
  if (iVar1 == 2) {
    pUVar2 = (UnsupportedType *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string((string *)&local_38,"pointers are not allowed in IDL",&local_39);
    Typelib::UnsupportedType::UnsupportedType(pUVar2,type,&local_38);
    __cxa_throw(pUVar2,&Typelib::UnsupportedType::typeinfo,
                Typelib::UnsupportedType::~UnsupportedType);
  }
  iVar1 = Typelib::Type::getCategory();
  if (iVar1 == 1) {
    Typelib::Indirect::getIndirection();
    iVar1 = Typelib::Type::getCategory();
    if (iVar1 - 1U < 2) {
      pUVar2 = (UnsupportedType *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string
                ((string *)&local_38,"multi-dimensional arrays are not supported yet",&local_39);
      Typelib::UnsupportedType::UnsupportedType(pUVar2,type,&local_38);
      __cxa_throw(pUVar2,&Typelib::UnsupportedType::typeinfo,
                  Typelib::UnsupportedType::~UnsupportedType);
    }
  }
  return;
}

Assistant:

void IDLExport::checkType(Type const& type)
{
    if (type.getCategory() == Type::Pointer)
        throw UnsupportedType(type, "pointers are not allowed in IDL");
    if (type.getCategory() == Type::Array)
    {
        Type::Category pointed_to = static_cast<Indirect const&>(type).getIndirection().getCategory();
        if (pointed_to == Type::Array || pointed_to == Type::Pointer)
            throw UnsupportedType(type, "multi-dimensional arrays are not supported yet");
    }

}